

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O0

int mriStep_SetPredictorMethod(ARKodeMem ark_mem,int pred_method)

{
  undefined4 in_ESI;
  int retval;
  ARKodeMRIStepMem step_mem;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  local_4 = mriStep_AccessStepMem
                      ((ARKodeMem)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                       in_stack_ffffffffffffffe0,
                       (ARKodeMRIStepMem *)
                       CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (local_4 == 0) {
    *(undefined4 *)(in_stack_ffffffffffffffe0 + 0xd0) = in_ESI;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mriStep_SetPredictorMethod(ARKodeMem ark_mem, int pred_method)
{
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* set parameter */
  step_mem->predictor = pred_method;

  return (ARK_SUCCESS);
}